

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint deflateFixed(ucvector *out,size_t *bp,Hash *hash,uchar *data,size_t datapos,size_t dataend,
                 LodePNGCompressSettings *settings,uint final)

{
  long in_RCX;
  ulong *in_RSI;
  long *in_RDI;
  Hash *in_R8;
  Hash *in_R9;
  uint unaff_retaddr;
  long in_stack_00000008;
  uint in_stack_00000010;
  uivector lz77_encoded;
  size_t i;
  uint error;
  uint BFINAL;
  HuffmanTree tree_d;
  HuffmanTree tree_ll;
  undefined4 in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff1c;
  undefined4 in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff24;
  undefined4 in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff2c;
  HuffmanTree *in_stack_ffffffffffffff70;
  HuffmanTree *in_stack_ffffffffffffff78;
  uivector *in_stack_ffffffffffffff80;
  uint uVar1;
  uint uVar2;
  size_t *in_stack_ffffffffffffff90;
  uint in_stack_ffffffffffffffb4;
  uint *in_stack_ffffffffffffffb8;
  uint *in_stack_ffffffffffffffc0;
  uchar *in_stack_ffffffffffffffc8;
  
  uVar1 = 0;
  HuffmanTree_init((HuffmanTree *)&stack0xffffffffffffffb0);
  HuffmanTree_init((HuffmanTree *)&stack0xffffffffffffff90);
  generateFixedLitLenTree
            ((HuffmanTree *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  generateFixedDistanceTree
            ((HuffmanTree *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  uVar2 = in_stack_00000010;
  if ((*in_RSI & 7) == 0) {
    ucvector_push_back((ucvector *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                       '\0');
    uVar2 = in_stack_00000010;
  }
  *(byte *)(*in_RDI + in_RDI[1] + -1) =
       *(byte *)(*in_RDI + in_RDI[1] + -1) | (byte)(uVar2 << ((byte)*in_RSI & 7));
  *in_RSI = *in_RSI + 1;
  if ((*in_RSI & 7) == 0) {
    ucvector_push_back((ucvector *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                       '\0');
  }
  *(byte *)(*in_RDI + in_RDI[1] + -1) =
       *(byte *)(*in_RDI + in_RDI[1] + -1) | (byte)(1 << ((byte)*in_RSI & 7));
  *in_RSI = *in_RSI + 1;
  if ((*in_RSI & 7) == 0) {
    ucvector_push_back((ucvector *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                       '\0');
  }
  *(byte *)(*in_RDI + in_RDI[1] + -1) =
       *(byte *)(*in_RDI + in_RDI[1] + -1) | (byte)(0 << ((byte)*in_RSI & 7));
  *in_RSI = *in_RSI + 1;
  if (*(int *)(in_stack_00000008 + 4) == 0) {
    for (; in_R8 < in_R9; in_R8 = (Hash *)((long)&in_R8->head + 1)) {
      HuffmanTree_getCode((HuffmanTree *)&stack0xffffffffffffffb0,
                          (uint)*(byte *)((long)&in_R8->head + in_RCX));
      HuffmanTree_getLength
                ((HuffmanTree *)&stack0xffffffffffffffb0,
                 (uint)*(byte *)((long)&in_R8->head + in_RCX));
      addHuffmanSymbol((size_t *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                       (ucvector *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),0,
                       0x5e1dfb);
    }
  }
  else {
    uivector_init((uivector *)&stack0xffffffffffffff68);
    in_stack_ffffffffffffff18 = *(undefined4 *)(in_stack_00000008 + 0xc);
    in_stack_ffffffffffffff20 = *(undefined4 *)(in_stack_00000008 + 0x10);
    uVar1 = encodeLZ77((uivector *)in_R8,in_R9,in_stack_ffffffffffffffc8,
                       (size_t)in_stack_ffffffffffffffc0,(size_t)in_stack_ffffffffffffffb8,
                       in_stack_ffffffffffffffb4,(uint)in_RSI,(uint)in_RDI,unaff_retaddr);
    if (uVar1 == 0) {
      writeLZ77data(in_stack_ffffffffffffff90,(ucvector *)((ulong)uVar2 << 0x20),
                    in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
    }
    uivector_cleanup((void *)0x5e1d67);
  }
  if (uVar1 == 0) {
    HuffmanTree_getCode((HuffmanTree *)&stack0xffffffffffffffb0,0x100);
    HuffmanTree_getLength((HuffmanTree *)&stack0xffffffffffffffb0,0x100);
    addHuffmanSymbol((size_t *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                     (ucvector *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),0,
                     0x5e1e6e);
  }
  HuffmanTree_cleanup((HuffmanTree *)0x5e1e7b);
  HuffmanTree_cleanup((HuffmanTree *)0x5e1e85);
  return uVar1;
}

Assistant:

static unsigned deflateFixed(ucvector* out, size_t* bp, Hash* hash,
                             const unsigned char* data,
                             size_t datapos, size_t dataend,
                             const LodePNGCompressSettings* settings, unsigned final)
{
  HuffmanTree tree_ll; /*tree for literal values and length codes*/
  HuffmanTree tree_d; /*tree for distance codes*/

  unsigned BFINAL = final;
  unsigned error = 0;
  size_t i;

  HuffmanTree_init(&tree_ll);
  HuffmanTree_init(&tree_d);

  generateFixedLitLenTree(&tree_ll);
  generateFixedDistanceTree(&tree_d);

  addBitToStream(bp, out, BFINAL);
  addBitToStream(bp, out, 1); /*first bit of BTYPE*/
  addBitToStream(bp, out, 0); /*second bit of BTYPE*/

  if(settings->use_lz77) /*LZ77 encoded*/
  {
    uivector lz77_encoded;
    uivector_init(&lz77_encoded);
    error = encodeLZ77(&lz77_encoded, hash, data, datapos, dataend, settings->windowsize,
                       settings->minmatch, settings->nicematch, settings->lazymatching);
    if(!error) writeLZ77data(bp, out, &lz77_encoded, &tree_ll, &tree_d);
    uivector_cleanup(&lz77_encoded);
  }
  else /*no LZ77, but still will be Huffman compressed*/
  {
    for(i = datapos; i < dataend; ++i)
    {
      addHuffmanSymbol(bp, out, HuffmanTree_getCode(&tree_ll, data[i]), HuffmanTree_getLength(&tree_ll, data[i]));
    }
  }
  /*add END code*/
  if(!error) addHuffmanSymbol(bp, out, HuffmanTree_getCode(&tree_ll, 256), HuffmanTree_getLength(&tree_ll, 256));

  /*cleanup*/
  HuffmanTree_cleanup(&tree_ll);
  HuffmanTree_cleanup(&tree_d);

  return error;
}